

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_tc.c
# Opt level: O0

olsrv2_tc_node * olsrv2_tc_node_add(netaddr *originator,uint64_t vtime,uint16_t ansn)

{
  long lVar1;
  olsrv2_tc_node *local_70;
  olsrv2_tc_node *local_68;
  olsrv2_tc_node *node;
  uint16_t ansn_local;
  uint64_t vtime_local;
  netaddr *originator_local;
  
  lVar1 = avl_find(&_tc_tree,originator);
  if (lVar1 == 0) {
    local_70 = (olsrv2_tc_node *)0x0;
  }
  else {
    local_70 = (olsrv2_tc_node *)(lVar1 + -0x150);
  }
  local_68 = local_70;
  if (local_70 == (olsrv2_tc_node *)0x0) {
    local_68 = (olsrv2_tc_node *)oonf_class_malloc(&_tc_node_class);
    if (local_68 == (olsrv2_tc_node *)0x0) {
      return (olsrv2_tc_node *)0x0;
    }
    os_routing_generic_init_half_os_route_key
              (&(local_68->target).prefix.src,(netaddr *)local_68,originator);
    (local_68->_originator_node).key = local_68;
    avl_init(&local_68->_edges,avl_comp_netaddr,0);
    avl_init(&local_68->_attached_networks,os_routing_avl_cmp_route_key,0);
    (local_68->_validity_time).class = &_validity_info;
    local_68->ansn = ansn;
    (local_68->target).type = OLSRV2_NODE_TARGET;
    olsrv2_routing_dijkstra_node_init(&(local_68->target)._dijkstra,(netaddr *)local_68);
    avl_insert(&_tc_tree,&local_68->_originator_node);
    oonf_class_event(&_tc_node_class,local_68,OONF_OBJECT_ADDED);
  }
  else if ((local_70->_validity_time)._clock == 0) {
    local_70->ansn = ansn;
    oonf_class_event(&_tc_node_class,local_70,OONF_OBJECT_ADDED);
  }
  oonf_timer_set_ext(&local_68->_validity_time,vtime,vtime);
  return local_68;
}

Assistant:

struct olsrv2_tc_node *
olsrv2_tc_node_add(struct netaddr *originator, uint64_t vtime, uint16_t ansn) {
  struct olsrv2_tc_node *node;

  node = avl_find_element(&_tc_tree, originator, node, _originator_node);
  if (!node) {
    node = oonf_class_malloc(&_tc_node_class);
    if (node == NULL) {
      return NULL;
    }

    /* copy key and attach it to node */
    os_routing_init_sourcespec_prefix(&node->target.prefix, originator);
    node->_originator_node.key = &node->target.prefix.dst;

    /* initialize node */
    avl_init(&node->_edges, avl_comp_netaddr, false);
    avl_init(&node->_attached_networks, os_routing_avl_cmp_route_key, false);

    node->_validity_time.class = &_validity_info;

    node->ansn = ansn;

    /* initialize dijkstra data */
    node->target.type = OLSRV2_NODE_TARGET;
    olsrv2_routing_dijkstra_node_init(&node->target._dijkstra, &node->target.prefix.dst);

    /* hook into global tree */
    avl_insert(&_tc_tree, &node->_originator_node);

    /* fire event */
    oonf_class_event(&_tc_node_class, node, OONF_OBJECT_ADDED);
  }
  else if (!oonf_timer_is_active(&node->_validity_time)) {
    /* node was virtual */
    node->ansn = ansn;

    /* fire event */
    oonf_class_event(&_tc_node_class, node, OONF_OBJECT_ADDED);
  }
  oonf_timer_set(&node->_validity_time, vtime);
  return node;
}